

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Float __thiscall pbrt::SummedAreaTable::Integral(SummedAreaTable *this,Bounds2f *extent)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  FVar1 = Lookup(this,(extent->pMax).super_Tuple2<pbrt::Point2,_float>.x,
                 (extent->pMax).super_Tuple2<pbrt::Point2,_float>.y);
  FVar2 = Lookup(this,(extent->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                 (extent->pMax).super_Tuple2<pbrt::Point2,_float>.y);
  FVar3 = Lookup(this,(extent->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                 (extent->pMin).super_Tuple2<pbrt::Point2,_float>.y);
  FVar4 = Lookup(this,(extent->pMax).super_Tuple2<pbrt::Point2,_float>.x,
                 (extent->pMin).super_Tuple2<pbrt::Point2,_float>.y);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar7 = vpsubd_avx(auVar7,auVar8);
  auVar6 = vpshufd_avx(auVar7,0x55);
  auVar6 = vpmulld_avx(auVar6,auVar7);
  auVar6 = vcvtdq2pd_avx(auVar6);
  dVar5 = (((double)FVar3 - (double)FVar4) + ((double)FVar1 - (double)FVar2)) / auVar6._0_8_;
  auVar6._0_4_ = (float)dVar5;
  auVar6._4_4_ = (int)((ulong)dVar5 >> 0x20);
  auVar6._8_8_ = 0;
  auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,auVar6);
  return auVar6._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Integral(const Bounds2f &extent) const {
        double s = (((double)Lookup(extent.pMax.x, extent.pMax.y) -
                     (double)Lookup(extent.pMin.x, extent.pMax.y)) +
                    ((double)Lookup(extent.pMin.x, extent.pMin.y) -
                     (double)Lookup(extent.pMax.x, extent.pMin.y)));
        return std::max<Float>(s / (sum.xSize() * sum.ySize()), 0);
    }